

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::printAR(KktCheck *this)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  int *in_RDI;
  int i_2;
  int i_1;
  int ind;
  size_t i;
  char buff [4];
  int local_38;
  int local_30;
  int local_20;
  ulong local_18;
  char local_c [12];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"N=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
  poVar3 = std::operator<<(poVar3,",  M=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[1]);
  poVar3 = std::operator<<(poVar3,",  NZ= ");
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)in_RDI[1]);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  local_18 = 0;
  while( true ) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14));
    if (sVar5 <= local_18) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),local_18);
    sprintf(local_c,"%2.1g ",*pvVar6);
    _Var2 = std::setw(5);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    std::operator<<(poVar3,local_c);
    local_18 = local_18 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"------AR | b----KktCheck-\n");
  in_RDI[0x44] = 0;
  do {
    if (in_RDI[1] <= in_RDI[0x44]) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"------l------\n");
      for (local_30 = 0; local_30 < *in_RDI; local_30 = local_30 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                            (long)local_30);
        if (*pvVar6 <= -1e+200) {
          sprintf(local_c,"-inf");
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                              (long)local_30);
          sprintf(local_c,"%2.1g ",*pvVar6);
        }
        _Var2 = std::setw(5);
        poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar3,local_c);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"------u------\n");
      for (local_38 = 0; local_38 < *in_RDI; local_38 = local_38 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)local_38);
        if (1e+200 < *pvVar6 || *pvVar6 == 1e+200) {
          sprintf(local_c,"inf");
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                              (long)local_38);
          sprintf(local_c,"%2.1g ",*pvVar6);
        }
        _Var2 = std::setw(5);
        poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar3,local_c);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      return;
    }
    in_RDI[0x45] = 0;
    while (in_RDI[0x45] < *in_RDI) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)in_RDI[0x44]);
      local_20 = *pvVar4;
      while( true ) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_20);
        bVar1 = false;
        if (*pvVar4 != in_RDI[0x45]) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),
                              (long)(in_RDI[0x44] + 1));
          bVar1 = local_20 < *pvVar4;
        }
        if (!bVar1) break;
        local_20 = local_20 + 1;
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_20);
      if (*pvVar4 == in_RDI[0x45]) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),
                            (long)(in_RDI[0x44] + 1));
        if (*pvVar4 <= local_20) goto LAB_001bcd44;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3e),
                            (long)local_20);
        sprintf(local_c,"%2.1g ",*pvVar6);
        _Var2 = std::setw(5);
        poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar3,local_c);
      }
      else {
LAB_001bcd44:
        _Var2 = std::setw(5);
        poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar3,"   ");
      }
      in_RDI[0x45] = in_RDI[0x45] + 1;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"  |   ");
    _Var2 = std::setw(5);
    poVar3 = std::operator<<(poVar3,_Var2);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),
                        (long)in_RDI[0x44]);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
    poVar3 = std::operator<<(poVar3," < < ");
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),
                        (long)in_RDI[0x44]);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    in_RDI[0x44] = in_RDI[0x44] + 1;
  } while( true );
}

Assistant:

void KktCheck::printAR() {
	cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<ARstart[numRow]<<'\n';	

	char buff [4];
	cout<<"\n-----cost-----\n";
	for (size_t i=0;i<colCost.size();i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------AR | b----KktCheck-\n";
	for (i=0;i<numRow;i++) {
		for (j=0;j<numCol;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1])
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{	
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
		
		}
		cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
	}
	cout<<endl;
	cout<<"------l------\n";
	for (int i=0;i<numCol;i++) { 
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else 
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<numCol;i++) { 
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else 
			sprintf(buff, "inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
}